

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

void __thiscall double_conversion::Bignum::AddBignum(Bignum *this,Bignum *other)

{
  short sVar1;
  long lVar2;
  int iVar3;
  Chunk CVar4;
  uint uVar5;
  ulong uVar6;
  short sVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  
  Align(this,other);
  sVar7 = this->used_bigits_;
  iVar8 = (int)sVar7;
  uVar5 = (uint)this->exponent_;
  sVar1 = other->used_bigits_;
  iVar11 = (int)other->exponent_;
  iVar3 = iVar11 + sVar1;
  if (iVar3 < (int)(iVar8 + uVar5)) {
    iVar3 = iVar8 + uVar5;
  }
  if ((int)(iVar3 - uVar5) < 0x80) {
    lVar10 = (long)iVar8;
    uVar9 = iVar11 - uVar5;
    if (iVar8 < (int)uVar9) {
      memset(this->bigits_buffer_ + lVar10,0,(ulong)((~uVar5 + iVar11) - iVar8) * 4 + 4);
    }
    if (sVar1 < 1) {
      uVar5 = 0;
    }
    else {
      lVar2 = (long)iVar11 * 4 + (long)(int)uVar5 * -4 + 4;
      uVar6 = 0;
      uVar5 = 0;
      do {
        iVar3 = 0;
        if ((long)((long)(int)uVar9 + uVar6) < lVar10) {
          iVar3 = *(int *)((long)this + uVar6 * 4 + lVar2);
        }
        uVar5 = iVar3 + uVar5 + other->bigits_buffer_[uVar6];
        *(uint *)((long)this + uVar6 * 4 + lVar2) = uVar5 & 0xfffffff;
        uVar5 = uVar5 >> 0x1c;
        uVar6 = uVar6 + 1;
      } while ((uint)(int)sVar1 != uVar6);
      uVar9 = uVar9 + (int)uVar6;
    }
    uVar6 = (ulong)uVar9;
    if (uVar5 != 0) {
      uVar6 = (ulong)(int)uVar9;
      do {
        CVar4 = 0;
        if ((long)uVar6 < lVar10) {
          CVar4 = this->bigits_buffer_[uVar6];
        }
        uVar9 = CVar4 + uVar5;
        this->bigits_buffer_[uVar6] = uVar9 & 0xfffffff;
        uVar5 = uVar9 >> 0x1c;
        uVar6 = uVar6 + 1;
      } while (0xfffffff < uVar9);
    }
    if (iVar8 < (int)uVar6) {
      sVar7 = (short)uVar6;
    }
    this->used_bigits_ = sVar7;
    return;
  }
  abort();
}

Assistant:

void Bignum::AddBignum(const Bignum& other) {
  DOUBLE_CONVERSION_ASSERT(IsClamped());
  DOUBLE_CONVERSION_ASSERT(other.IsClamped());

  // If this has a greater exponent than other append zero-bigits to this.
  // After this call exponent_ <= other.exponent_.
  Align(other);

  // There are two possibilities:
  //   aaaaaaaaaaa 0000  (where the 0s represent a's exponent)
  //     bbbbb 00000000
  //   ----------------
  //   ccccccccccc 0000
  // or
  //    aaaaaaaaaa 0000
  //  bbbbbbbbb 0000000
  //  -----------------
  //  cccccccccccc 0000
  // In both cases we might need a carry bigit.

  EnsureCapacity(1 + (std::max)(BigitLength(), other.BigitLength()) - exponent_);
  Chunk carry = 0;
  int bigit_pos = other.exponent_ - exponent_;
  DOUBLE_CONVERSION_ASSERT(bigit_pos >= 0);
  for (int i = used_bigits_; i < bigit_pos; ++i) {
    RawBigit(i) = 0;
  }
  for (int i = 0; i < other.used_bigits_; ++i) {
    const Chunk my = (bigit_pos < used_bigits_) ? RawBigit(bigit_pos) : 0;
    const Chunk sum = my + other.RawBigit(i) + carry;
    RawBigit(bigit_pos) = sum & kBigitMask;
    carry = sum >> kBigitSize;
    ++bigit_pos;
  }
  while (carry != 0) {
    const Chunk my = (bigit_pos < used_bigits_) ? RawBigit(bigit_pos) : 0;
    const Chunk sum = my + carry;
    RawBigit(bigit_pos) = sum & kBigitMask;
    carry = sum >> kBigitSize;
    ++bigit_pos;
  }
  used_bigits_ = static_cast<int16_t>(std::max(bigit_pos, static_cast<int>(used_bigits_)));
  DOUBLE_CONVERSION_ASSERT(IsClamped());
}